

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O3

Node * __thiscall czh::node::Node::get_ref(Node *this,Reference *ref,source_location *l)

{
  Node *pNVar1;
  source_location *l_00;
  bool bVar2;
  Node *pNVar3;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __tmp;
  pointer tag;
  undefined1 local_60 [32];
  Node *local_40;
  source_location *local_38;
  
  tag = (ref->path).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish;
  pNVar3 = this;
  if (*(__index_type *)
       ((long)&(this->data).super__Variant_base<czh::node::Node::NodeData,_czh::value::Value>.
               super__Move_assign_alias<czh::node::Node::NodeData,_czh::value::Value>.
               super__Copy_assign_alias<czh::node::Node::NodeData,_czh::value::Value>.
               super__Move_ctor_alias<czh::node::Node::NodeData,_czh::value::Value>.
               super__Copy_ctor_alias<czh::node::Node::NodeData,_czh::value::Value>.
               super__Variant_storage_alias<czh::node::Node::NodeData,_czh::value::Value> + 0x48) !=
      '\0') {
    pNVar3 = this->last_node;
  }
  if (tag[-1]._M_string_length == 0) {
    tag = tag + -1;
    pNVar1 = pNVar3;
    do {
      pNVar3 = pNVar1;
      pNVar1 = pNVar3->last_node;
    } while (pNVar3->last_node != (Node *)0x0);
  }
  if ((ref->path).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start < tag) {
    local_40 = this;
    local_38 = l;
    do {
      tag = tag + -1;
      local_60._0_8_ = &PTR_s__workspace_llm4binary_github_lic_0019c710;
      bVar2 = has_node(pNVar3,tag,(source_location *)local_60);
      if (!bVar2) {
        pNVar1 = pNVar3->last_node;
        local_60._0_8_ = (__impl *)(local_60 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"Unknown reference.","");
        l_00 = local_38;
        if (pNVar1 == (Node *)0x0) {
          report_error((string *)local_60,&local_40->czh_token,local_38);
        }
        if ((__impl *)local_60._0_8_ != (__impl *)(local_60 + 0x10)) {
          operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
        }
        pNVar3 = get_ref(pNVar3->last_node,ref,l_00);
        return pNVar3;
      }
      local_60._0_8_ = &PTR_s__workspace_llm4binary_github_lic_0019c770;
      pNVar3 = operator()(pNVar3,tag,(source_location *)local_60);
    } while ((ref->path).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start < tag);
  }
  return pNVar3;
}

Assistant:

Node *get_ref(const value::Reference &ref, const std::source_location &l =
    std::source_location::current()) const
    {
      Node *nptr = last_node;
      auto rit = ref.path.crbegin();
      if (is_node())
      {
        nptr = const_cast<Node *>(this);
      }
      if (rit->empty())
      {
        while (nptr->last_node != nullptr)
        {
          nptr = nptr->last_node;
        }
        rit++;
      }
  
      for (; rit < ref.path.crend(); ++rit)
      {
        if (!nptr->has_node(*rit))
        {
          assert_true(nptr->last_node != nullptr, "Unknown reference.", czh_token, l);
          return nptr->last_node->get_ref(ref, l);
        }
        else
        {
          nptr = &(*nptr)[*rit];
        }
      }
      return nptr;
    }